

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_orc_i32_s390x(TCGContext_conflict12 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGv_i32 ret_00;
  uintptr_t o;
  
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_not_i32(tcg_ctx,ret_00,arg2);
  tcg_gen_or_i32(tcg_ctx,ret,arg1,ret_00);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_orc_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (TCG_TARGET_HAS_orc_i32) {
        tcg_gen_op3_i32(tcg_ctx, INDEX_op_orc_i32, ret, arg1, arg2);
    } else {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_not_i32(tcg_ctx, t0,arg2);
        tcg_gen_or_i32(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}